

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

void enet_host_destroy(ENetHost *host)

{
  ENetPeer *peer;
  void *pvVar1;
  _func_void_void_ptr *p_Var2;
  ulong uVar3;
  
  if (host != (ENetHost *)0x0) {
    enet_socket_destroy(host->socket);
    for (uVar3 = 0; uVar3 < host->peerCount; uVar3 = uVar3 + 1) {
      peer = host->peer_list[uVar3];
      enet_peer_reset(peer);
      enet_free(peer);
      host->peer_list[uVar3] = (ENetPeer *)0x0;
    }
    pvVar1 = (host->compressor).context;
    if ((pvVar1 != (void *)0x0) &&
       (p_Var2 = (host->compressor).destroy, p_Var2 != (_func_void_void_ptr *)0x0)) {
      (*p_Var2)(pvVar1);
    }
    enet_free(host->peer_list);
    enet_free(host);
    return;
  }
  return;
}

Assistant:

void
enet_host_destroy (ENetHost * host)
{
    ENetPeer * currentPeer;
    int i;

    if (host == NULL)
      return;

    enet_socket_destroy (host -> socket);

    for (i = 0; i < host -> peerCount; i++ )
    {
       currentPeer = host -> peer_list[i];
       enet_peer_reset (currentPeer);
       enet_free (currentPeer);
       host -> peer_list[i] = NULL;
    }

    if (host -> compressor.context != NULL && host -> compressor.destroy)
      (* host -> compressor.destroy) (host -> compressor.context);

    enet_free (host -> peer_list);
    enet_free (host);
}